

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

ExprPtr __thiscall
mathiu::impl::
set<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>
          (impl *this,shared_ptr<const_mathiu::impl::Expr> *lst,
          shared_ptr<const_mathiu::impl::Expr> *lst_1,shared_ptr<const_mathiu::impl::Expr> *lst_2)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  _Base_ptr p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  size_t *psVar5;
  _Base_ptr p_Var6;
  long lVar7;
  ExprPtr EVar8;
  initializer_list<std::shared_ptr<const_mathiu::impl::Expr>_> __l;
  undefined8 uStack_78;
  shared_ptr<const_mathiu::impl::Expr> local_70;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_40;
  
  local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (lst->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (lst->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_70.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_60 = (lst_1->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_58 = (lst_1->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  local_50 = (lst_2->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_48 = (lst_2->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  __l._M_len = 3;
  __l._M_array = &local_70;
  std::
  set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::set((set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
         *)&local_40,__l,(ExprPtrLess *)((long)&uStack_78 + 7),
        (allocator_type *)((long)&uStack_78 + 6));
  puVar2 = (undefined8 *)operator_new(0x50);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00263778;
  p_Var3 = (_Base_ptr)(puVar2 + 3);
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    puVar2[4] = 0;
    psVar5 = puVar2 + 7;
    local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    p_Var6 = p_Var3;
  }
  else {
    p_Var1 = &local_40._M_impl.super__Rb_tree_header;
    puVar2[4] = local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var3;
    psVar5 = &local_40._M_impl.super__Rb_tree_header._M_node_count;
    puVar2[7] = local_40._M_impl.super__Rb_tree_header._M_node_count;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var3 = local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = local_40._M_impl.super__Rb_tree_header._M_header._M_right;
    local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  puVar2[5] = p_Var3;
  puVar2[6] = p_Var6;
  *psVar5 = 0;
  *(_Rb_tree_color *)(puVar2 + 3) = local_40._M_impl.super__Rb_tree_header._M_header._M_color;
  *(undefined1 *)(puVar2 + 9) = 0xd;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined8 **)this = puVar2 + 2;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree(&local_40);
  lVar7 = 0x30;
  _Var4._M_pi = extraout_RDX;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_78 + lVar7) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_78 + lVar7));
      _Var4._M_pi = extraout_RDX_00;
    }
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != 0);
  EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ExprPtr set(Ts &&... lst)
        {
            return makeSharedExprPtr(Set{{lst...}});
        }